

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O2

void __thiscall cali::Blackboard::snapshot(Blackboard *this,SnapshotBuilder *rec)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  
  for (uVar4 = this->toctoc; uVar4 != 0; uVar4 = uVar4 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3)
      ) {
    uVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    bVar3 = (byte)uVar1 & 0x1f;
    for (uVar5 = this->toc[uVar1]; uVar5 != 0; uVar5 = uVar5 & ~(1 << (uVar2 & 0x1f))) {
      uVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      SnapshotBuilder::append
                (rec,(Entry *)((long)&this->hashtable[0].value.m_node +
                              (ulong)((uVar2 | uVar1 << 5) << 5)));
    }
  }
  return;
}

Assistant:

void Blackboard::snapshot(SnapshotBuilder& rec) const
{
    int tmptoc = toctoc;

    while (tmptoc) {
        int i = first_high_bit(tmptoc) - 1;
        tmptoc &= ~(1 << i);

        int tmp = toc[i];
        while (tmp) {
            int j = first_high_bit(tmp) - 1;
            tmp &= ~(1 << j);

            rec.append(hashtable[i * 32 + j].value);
        }
    }
}